

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asStructList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize elementSize)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  BuilderArena *pBVar4;
  uint amount;
  int iVar5;
  SegmentBuilder *this_00;
  unsigned_long uVar6;
  SegmentBuilder *pSVar7;
  ulong uVar8;
  SegmentBuilder *pSVar9;
  undefined8 *puVar10;
  ushort uVar11;
  ListElementCount LVar12;
  OrphanBuilder *pOVar13;
  word *pwVar14;
  ushort uVar15;
  uint uVar16;
  WirePointer *pWVar17;
  WirePointer *pWVar18;
  SegmentBuilder **ppSVar19;
  StructSize SVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  byte bVar24;
  ListElementCount LVar25;
  WirePointer *dst;
  AllocateResult AVar26;
  AllocateResult AVar27;
  Fault f;
  Iterator __end5;
  WirePointer *local_d0;
  WirePointer *local_c8;
  WirePointer *local_c0;
  Fault local_b8;
  uint local_ac;
  ListBuilder *local_a8;
  ulong local_a0;
  BuilderArena *local_98;
  ulong local_90;
  CapTableBuilder *local_88;
  WirePointer *local_80;
  ulong local_78;
  ulong local_70;
  WirePointer *local_68;
  OrphanBuilder *local_60;
  uint local_54;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  uVar21 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  local_a8 = __return_storage_ptr__;
  if (id.value != 0 || uVar21 != 0) {
    pSVar9 = this->segment;
    local_88 = this->capTable;
    pBVar4 = (BuilderArena *)(pSVar9->super_SegmentReader).arena;
    if ((uVar21 & 3) == 2) {
      this_00 = BuilderArena::getSegment(pBVar4,id);
      uVar21 = (uint)(this->tag).content;
      pwVar14 = (this_00->super_SegmentReader).ptr.ptr;
      uVar8 = (ulong)(uVar21 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar14->content + uVar8);
      pOVar13 = (OrphanBuilder *)((long)&pwVar14[1].content + uVar8);
      if ((uVar21 & 4) == 0) {
        pWVar18 = (WirePointer *)(&pOVar13->tag + ((int)(pOVar1->tag).content >> 2));
        pOVar13 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pWVar18 = (WirePointer *)
                  ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                  (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pWVar18 = (WirePointer *)this->location;
      this_00 = pSVar9;
      pOVar13 = this;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    if (((pOVar13->tag).content & 3) == 1) {
      uVar16 = (uint)elementSize >> 0x10;
      uVar21 = *(uint *)((long)&(pOVar13->tag).content + 4);
      bVar24 = (byte)uVar21 & 7;
      uVar11 = elementSize.data;
      uVar15 = elementSize.pointers;
      local_98 = pBVar4;
      local_60 = this;
      if (bVar24 == 7) {
        uVar21 = (uint)*(uint64_t *)&(pWVar18->offsetAndKind).value;
        if ((uVar21 & 3) == 0) {
          pWVar17 = pWVar18 + 1;
          uVar2 = *(ushort *)&pWVar18->field_1;
          local_50 = (ulong)uVar2;
          uVar3 = *(ushort *)((long)&pWVar18->field_1 + 2);
          local_38 = (ulong)uVar3;
          local_a0 = (ulong)((uint)uVar3 + (uint)uVar2);
          uVar21 = uVar21 >> 2 & 0x1fffffff;
          local_70 = (ulong)uVar21;
          SVar20.pointers = 0;
          SVar20.data = uVar2;
          if (uVar3 < uVar15 || uVar2 < uVar11) {
            if (uVar2 <= uVar11) {
              SVar20 = elementSize;
            }
            local_ac = uVar16;
            if (uVar15 < uVar3) {
              local_ac = (uint)uVar3;
            }
            local_54 = (uint)SVar20 & 0xffff;
            local_90 = (ulong)(local_ac + local_54);
            uVar6 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_1_>
                              (local_90 * local_70,(anon_class_1_0_00000001 *)&local_b8);
            if ((((this->tag).content & 3) == 2) &&
               (pSVar7 = BuilderArena::getSegment
                                   ((BuilderArena *)(pSVar9->super_SegmentReader).arena,
                                    (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
               pSVar7->readOnly == false)) {
              uVar21 = (uint)(this->tag).content;
              puVar10 = (undefined8 *)
                        ((long)&((pSVar7->super_SegmentReader).ptr.ptr)->content +
                        (ulong)(uVar21 & 0xfffffff8));
              if ((uVar21 & 4) == 0) {
                *puVar10 = 0;
              }
              else {
                *puVar10 = 0;
                puVar10[1] = 0;
              }
            }
            (this->tag).content = 0;
            iVar5 = (int)uVar6;
            uVar21 = iVar5 + 1;
            if (local_98 == (BuilderArena *)0x0) {
              pwVar14 = pSVar9->pos;
              AVar26.words = pwVar14;
              AVar26.segment = pSVar9;
              if (((long)((long)(pSVar9->super_SegmentReader).ptr.ptr +
                         ((pSVar9->super_SegmentReader).ptr.size_ * 8 - (long)pwVar14)) >> 3 <
                   (long)(ulong)uVar21) || (pSVar9->pos = pwVar14 + uVar21, pwVar14 == (word *)0x0))
              {
                pBVar4 = (BuilderArena *)(pSVar9->super_SegmentReader).arena;
                uVar21 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                                   (iVar5 + 2,(anon_class_1_0_00000001 *)&local_b8);
                AVar27 = BuilderArena::allocate(pBVar4,uVar21);
                pOVar13 = (OrphanBuilder *)AVar27.words;
                pSVar9 = AVar27.segment;
                *(uint *)&(this->tag).content =
                     (int)AVar27.words - *(int *)&(pSVar9->super_SegmentReader).ptr.ptr &
                     0xfffffff8U | 2;
                *(uint *)((long)&(this->tag).content + 4) = (pSVar9->super_SegmentReader).id.value;
                *(undefined4 *)&(pOVar13->tag).content = 1;
                AVar26.words = (word *)&pOVar13->segment;
                AVar26.segment = pSVar9;
                this = pOVar13;
              }
              else {
                *(uint *)&(this->tag).content =
                     ((uint)((ulong)((long)pwVar14 - (long)this) >> 1) & 0xfffffffc) - 3;
              }
            }
            else {
              AVar26 = BuilderArena::allocate(local_98,uVar21);
              *(undefined4 *)&(this->tag).content = 0xfffffffd;
            }
            pwVar14 = AVar26.words;
            *(int *)((long)&(this->tag).content + 4) = iVar5 * 8 + 7;
            *(int *)&pwVar14->content = (int)local_70 * 4;
            *(StructDataWordCount *)((long)&pwVar14->content + 4) = SVar20.data;
            *(short *)((long)&pwVar14->content + 6) = (short)local_ac;
            local_48 = (size_t)(uint)((int)local_50 << 3);
            local_98 = (BuilderArena *)(local_a0 & 0xffffffff);
            local_c8 = (WirePointer *)(pwVar14 + (ulong)((uint)SVar20 & 0xffff) + 1);
            local_c0 = (WirePointer *)(pwVar14 + 1);
            local_40 = (ulong)(uint)((int)local_90 * 8);
            local_d0 = (WirePointer *)((long)&pWVar18[1].offsetAndKind.value + local_48);
            local_a0 = (ulong)(uint)((int)local_a0 << 3);
            LVar12 = 0;
            local_80 = pWVar18;
            local_68 = local_c0;
            while (pWVar18 = local_80, LVar25 = (ListElementCount)local_70, LVar12 != LVar25) {
              local_78 = CONCAT44(local_78._4_4_,LVar12);
              uVar8 = local_38;
              pWVar18 = local_d0;
              dst = local_c8;
              if ((short)local_50 != 0) {
                memcpy(local_c0,pWVar17,local_48);
                uVar8 = local_38;
              }
              while (uVar8 != 0) {
                WireHelpers::transferPointer(AVar26.segment,dst,this_00,pWVar18);
                uVar8 = uVar8 - 1;
                pWVar18 = pWVar18 + 1;
                dst = dst + 1;
              }
              local_c0 = local_c0 + local_90;
              pWVar17 = pWVar17 + (long)local_98;
              local_c8 = (WirePointer *)((long)&(local_c8->offsetAndKind).value + local_40);
              local_d0 = (WirePointer *)((long)&(local_d0->offsetAndKind).value + local_a0);
              LVar12 = (int)local_78 + 1;
            }
            uVar6 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_2_>
                              ((long)local_98 * local_70,(anon_class_1_0_00000001 *)&local_b8);
            uVar21 = local_ac;
            iVar5 = (int)uVar6 + 1;
            if (iVar5 != 0) {
              memset(pWVar18,0,(ulong)(uint)(iVar5 * 8));
            }
            local_a8->segment = AVar26.segment;
            local_a8->capTable = local_88;
            local_a8->ptr = (byte *)local_68;
            local_a8->elementCount = LVar25;
            local_a8->step = (int)local_90 << 6;
            local_a8->structDataSize = local_54 << 6;
            local_a8->structPointerCount = (StructPointerCount)uVar21;
            this = local_60;
          }
          else {
            local_a8->segment = this_00;
            local_a8->capTable = local_88;
            local_a8->ptr = (byte *)pWVar17;
            local_a8->elementCount = uVar21;
            local_a8->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
            local_a8->structDataSize = (uint)uVar2 << 6;
            local_a8->structPointerCount = uVar3;
            local_68 = pWVar17;
          }
          goto LAB_0028fc65;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                  (&local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x5af,FAILED,"oldTag->kind() == WirePointer::STRUCT",
                   "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                   (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.");
      }
      else {
        local_78 = (ulong)(uVar21 >> 3);
        if ((uVar21 & 7) == 0) {
          uVar21 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                             (uVar21 >> 3,(anon_class_1_0_00000001 *)&local_b8);
          uVar16 = uVar16 + ((uint)elementSize & 0xffff);
          uVar6 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                            ((ulong)uVar16 * (ulong)uVar21,(anon_class_1_0_00000001 *)&local_b8);
          if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
            WireHelpers::zeroObject(pSVar9,local_88,(WirePointer *)this);
          }
          ppSVar19 = (SegmentBuilder **)pSVar9->pos;
          uVar8 = uVar6 + 1 & 0xffffffff;
          if (((long)((long)(pSVar9->super_SegmentReader).ptr.ptr +
                     ((pSVar9->super_SegmentReader).ptr.size_ * 8 - (long)ppSVar19)) >> 3 <
               (long)uVar8) ||
             (pSVar9->pos = (word *)(ppSVar19 + uVar8), ppSVar19 == (SegmentBuilder **)0x0)) {
            pBVar4 = (BuilderArena *)(pSVar9->super_SegmentReader).arena;
            amount = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                               ((int)uVar6 + 2,(anon_class_1_0_00000001 *)&local_b8);
            AVar27 = BuilderArena::allocate(pBVar4,amount);
            pOVar13 = (OrphanBuilder *)AVar27.words;
            pSVar9 = AVar27.segment;
            *(uint *)&(this->tag).content =
                 (int)AVar27.words - *(int *)&(pSVar9->super_SegmentReader).ptr.ptr & 0xfffffff8U |
                 2;
            *(uint *)((long)&(this->tag).content + 4) = (pSVar9->super_SegmentReader).id.value;
            *(undefined4 *)&(pOVar13->tag).content = 1;
            ppSVar19 = &pOVar13->segment;
          }
          else {
            *(uint *)&(this->tag).content =
                 ((uint)((ulong)((long)ppSVar19 - (long)this) >> 1) & 0xfffffffc) - 3;
            pOVar13 = this;
          }
          *(int *)((long)&(pOVar13->tag).content + 4) = (int)uVar6 * 8 + 7;
          *(uint *)ppSVar19 = uVar21 << 2;
          *(ushort *)((long)ppSVar19 + 4) = uVar11;
          *(ushort *)((long)ppSVar19 + 6) = uVar15;
          local_68 = (WirePointer *)(ppSVar19 + 1);
          local_a8->segment = pSVar9;
          local_a8->capTable = local_88;
          local_a8->ptr = (byte *)local_68;
          local_a8->elementCount = uVar21;
          local_a8->step = uVar16 * 0x40;
          local_a8->structDataSize = ((uint)elementSize & 0xffff) << 6;
          local_a8->structPointerCount = uVar15;
          goto LAB_0028fc65;
        }
        if (bVar24 != 1) {
          local_70 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar24 * 4);
          if (bVar24 == 6) {
            uVar16 = uVar16 + (uVar16 == 0);
          }
          else {
            elementSize = (StructSize)
                          (((uint)elementSize & 0xffff) + (uint)(((uint)elementSize & 0xffff) == 0))
            ;
          }
          local_90 = (ulong)((uint)elementSize & 0xffff);
          local_a0 = (ulong)((uVar16 & 0xffff) + ((uint)elementSize & 0xffff));
          local_ac = uVar16;
          local_80 = pWVar18;
          uVar6 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_3_>
                            (local_a0 * local_78,(anon_class_1_0_00000001 *)&local_b8);
          if ((((this->tag).content & 3) == 2) &&
             (pSVar7 = BuilderArena::getSegment
                                 ((BuilderArena *)(pSVar9->super_SegmentReader).arena,
                                  (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
             pSVar7->readOnly == false)) {
            uVar21 = (uint)(this->tag).content;
            puVar10 = (undefined8 *)
                      ((long)&((pSVar7->super_SegmentReader).ptr.ptr)->content +
                      (ulong)(uVar21 & 0xfffffff8));
            if ((uVar21 & 4) == 0) {
              *puVar10 = 0;
            }
            else {
              *puVar10 = 0;
              puVar10[1] = 0;
            }
          }
          (this->tag).content = 0;
          iVar5 = (int)uVar6;
          uVar21 = iVar5 + 1;
          pOVar13 = this;
          if (local_98 == (BuilderArena *)0x0) {
            pwVar14 = pSVar9->pos;
            AVar27.words = pwVar14;
            AVar27.segment = pSVar9;
            if (((long)((long)(pSVar9->super_SegmentReader).ptr.ptr +
                       ((pSVar9->super_SegmentReader).ptr.size_ * 8 - (long)pwVar14)) >> 3 <
                 (long)(ulong)uVar21) || (pSVar9->pos = pwVar14 + uVar21, pwVar14 == (word *)0x0)) {
              pBVar4 = (BuilderArena *)(pSVar9->super_SegmentReader).arena;
              uVar21 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                                 (iVar5 + 2,(anon_class_1_0_00000001 *)&local_b8);
              AVar27 = BuilderArena::allocate(pBVar4,uVar21);
              pOVar13 = (OrphanBuilder *)AVar27.words;
              pSVar9 = AVar27.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar27.words - *(int *)&(pSVar9->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar9->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar13->tag).content = 1;
              AVar27.words = (word *)&pOVar13->segment;
              AVar27.segment = pSVar9;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar14 - (long)this) >> 1) & 0xfffffffc) - 3;
            }
          }
          else {
            AVar27 = BuilderArena::allocate(local_98,uVar21);
            *(undefined4 *)&(this->tag).content = 0xfffffffd;
          }
          pwVar14 = AVar27.words;
          uVar21 = (uint)local_70;
          pWVar18 = (WirePointer *)(pwVar14 + 1);
          *(int *)((long)&(pOVar13->tag).content + 4) = iVar5 * 8 + 7;
          *(int *)&pwVar14->content = (int)local_78 * 4;
          *(StructDataWordCount *)((long)&pwVar14->content + 4) = elementSize.data;
          *(short *)((long)&pwVar14->content + 6) = (short)local_ac;
          iVar5 = (int)local_a0;
          local_68 = pWVar18;
          if (bVar24 == 6) {
            pWVar18 = pWVar18 + local_90;
            uVar8 = local_78 & 0xffffffff;
            pWVar17 = local_80;
            while (iVar22 = (int)uVar8, uVar8 = (ulong)(iVar22 - 1), iVar22 != 0) {
              WireHelpers::transferPointer(AVar27.segment,pWVar18,this_00,pWVar17);
              pWVar17 = pWVar17 + 1;
              pWVar18 = (WirePointer *)
                        ((long)&(pWVar18->offsetAndKind).value + (ulong)(uint)(iVar5 * 8));
            }
          }
          else {
            uVar8 = (ulong)(uVar21 >> 3);
            uVar23 = local_78 & 0xffffffff;
            pWVar17 = local_80;
            while (iVar22 = (int)uVar23, uVar23 = (ulong)(iVar22 - 1), iVar22 != 0) {
              if (0xfffffffffffffffb < (ulong)bVar24 - 6) {
                memcpy(pWVar18,pWVar17,uVar8);
              }
              pWVar17 = (WirePointer *)((long)&(pWVar17->offsetAndKind).value + uVar8);
              pWVar18 = (WirePointer *)
                        ((long)&(pWVar18->offsetAndKind).value + (ulong)(uint)(iVar5 * 8));
            }
          }
          uVar8 = local_78;
          uVar6 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_4_>
                            (((uint)(bVar24 == 6) * 0x40 + uVar21) * local_78 + 0x3f >> 6,
                             (anon_class_1_0_00000001 *)&local_b8);
          if ((int)uVar6 != 0) {
            memset(local_80,0,(ulong)(uint)((int)uVar6 << 3));
          }
          local_a8->segment = AVar27.segment;
          local_a8->capTable = local_88;
          local_a8->ptr = (byte *)local_68;
          local_a8->elementCount = (ListElementCount)uVar8;
          local_a8->step = (int)local_a0 << 6;
          local_a8->structDataSize = (int)local_90 << 6;
          local_a8->structPointerCount = (StructPointerCount)local_ac;
          this = local_60;
          goto LAB_0028fc65;
        }
        local_80 = pWVar18;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                  (&local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x603,FAILED,"oldSize != ElementSize::BIT",
                   "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                   ,(char (*) [106])
                    "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68]>
                (&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x5a3,FAILED,"oldRef->kind() == WirePointer::LIST",
                 "\"Called getList{Field,Element}() but existing pointer is not a list.\"",
                 (char (*) [68])
                 "Called getList{Field,Element}() but existing pointer is not a list.");
    }
    kj::_::Debug::Fault::~Fault(&local_b8);
  }
  local_a8->ptr = (byte *)0x0;
  local_a8->elementCount = 0;
  local_a8->step = 0;
  local_a8->segment = (SegmentBuilder *)0x0;
  local_a8->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&local_a8->step + 2) = 0;
  local_68 = (WirePointer *)0x0;
LAB_0028fc65:
  local_a8->elementSize = INLINE_COMPOSITE;
  pOVar13 = (OrphanBuilder *)(local_68 + -1);
  if (local_68 == (WirePointer *)0x0) {
    pOVar13 = (OrphanBuilder *)0x0;
  }
  this->location = &pOVar13->tag;
  return local_a8;
}

Assistant:

ListBuilder OrphanBuilder::asStructList(StructSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableStructListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}